

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VincentyDestination.cpp
# Opt level: O0

LLPoint GeoCalcs::DestVincenty(LLPoint *pt,double brng,double dist)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double L;
  double C;
  double lambda;
  double lat2;
  double tmp;
  double deltaSigma;
  double cos2SigmaSq;
  double dStack_c0;
  int iterLimit;
  double cos2SigmaM;
  double cosSigma;
  double sinSigma;
  double sigmaP;
  double sigma;
  double B;
  double A;
  double uSq;
  double cosSqAlpha;
  double sinAlpha;
  double sigma1;
  double sinU1;
  double cosU1;
  double tanU1;
  double cosAlpha1;
  double sinAlpha1;
  double alpha1;
  double s;
  double dist_local;
  double brng_local;
  LLPoint *pt_local;
  
  dVar2 = sin(brng);
  dVar3 = cos(brng);
  dVar4 = tan(pt->latitude);
  dVar4 = dVar4 * 0.99664718933526;
  dVar5 = sqrt(dVar4 * dVar4 + 1.0);
  dVar5 = 1.0 / dVar5;
  dVar6 = dVar4 * dVar5;
  dVar4 = atan2(dVar4,dVar3);
  dVar7 = dVar5 * dVar2;
  dVar8 = -dVar7 * dVar7 + 1.0;
  dVar9 = (dVar8 * 272331606106.95312) / 40408299984662.05;
  dVar10 = (dVar9 / 16384.0) * (dVar9 * (dVar9 * (dVar9 * -175.0 + 320.0) + -768.0) + 4096.0) + 1.0;
  dVar9 = (dVar9 / 1024.0) * (dVar9 * (dVar9 * (dVar9 * -47.0 + 74.0) + -128.0) + 256.0);
  sigmaP = dist / (dVar10 * 6356752.314245227);
  sinSigma = 6.283185307179586;
  cosSigma = sin(sigmaP);
  cos2SigmaM = cos(sigmaP);
  dStack_c0 = cos(dVar4 + dVar4 + sigmaP);
  cos2SigmaSq._4_4_ = 0;
  while( true ) {
    bVar1 = false;
    if (5e-16 < ABS(sigmaP - sinSigma)) {
      cos2SigmaSq._4_4_ = cos2SigmaSq._4_4_ + 1;
      bVar1 = cos2SigmaSq._4_4_ < 100;
    }
    if (!bVar1) break;
    dStack_c0 = cos(dVar4 + dVar4 + sigmaP);
    cosSigma = sin(sigmaP);
    cos2SigmaM = cos(sigmaP);
    dVar11 = dStack_c0 * dStack_c0;
    sinSigma = sigmaP;
    sigmaP = dist / (dVar10 * 6356752.314245227) +
             dVar9 * cosSigma *
             (dVar9 * 0.25 *
              (cos2SigmaM * (dVar11 + dVar11 + -1.0) +
              -((dVar9 / 6.0) * dStack_c0 * (cosSigma * 4.0 * cosSigma + -3.0) *
               (dVar11 * 4.0 + -3.0))) + dStack_c0);
  }
  dVar4 = dVar6 * cosSigma - dVar5 * cos2SigmaM * dVar3;
  dVar4 = sqrt(dVar7 * dVar7 + dVar4 * dVar4);
  dVar4 = atan2(dVar6 * cos2SigmaM + dVar5 * cosSigma * dVar3,dVar4 * 0.99664718933526);
  dVar2 = atan2(cosSigma * dVar2,dVar5 * cos2SigmaM - dVar6 * cosSigma * dVar3);
  dVar3 = dVar8 * 0.00020955066654624997 * ((dVar8 * -3.0 + 4.0) * 0.0033528106647399995 + 4.0);
  LLPOINT::LLPOINT((LLPOINT *)&pt_local,dVar4,
                   pt->longitude +
                   (dVar2 - (1.0 - dVar3) * 0.0033528106647399995 * dVar7 *
                            (dVar3 * cosSigma *
                             (dVar3 * cos2SigmaM * ((dStack_c0 + dStack_c0) * dStack_c0 + -1.0) +
                             dStack_c0) + sigmaP)));
  return _pt_local;
}

Assistant:

LLPoint DestVincenty(const LLPoint &pt, double brng, double dist)
    {
        double s = dist;
        double alpha1 = brng;
        double sinAlpha1 = sin(alpha1);
        double cosAlpha1 = cos(alpha1);

        double tanU1 = (1.0 - kFlattening) * tan(pt.latitude);
        double cosU1 = 1.0 / sqrt((1.0 + tanU1 * tanU1));
        double sinU1 = tanU1 * cosU1;
        double sigma1 = atan2(tanU1, cosAlpha1);
        double sinAlpha = cosU1 * sinAlpha1;
        double cosSqAlpha = 1.0 - sinAlpha * sinAlpha;
        double uSq = cosSqAlpha * (kSemiMajorAxis * kSemiMajorAxis - kSemiMinorAxis * kSemiMinorAxis) /
                     (kSemiMinorAxis * kSemiMinorAxis);
        double A = 1.0 + uSq / 16384.0 * (4096.0 + uSq * (-768.0 + uSq * (320.0 - 175.0 * uSq)));
        double B = uSq / 1024.0 * (256.0 + uSq * (-128.0 + uSq * (74.0 - 47.0 * uSq)));

        double sigma = s / (kSemiMinorAxis * A);
        double sigmaP = M_2PI;
        double sinSigma = sin(sigma);
        double cosSigma = cos(sigma);
        double cos2SigmaM = cos(2.0 * sigma1 + sigma);
        int iterLimit = 0;
        while (fabs(sigma - sigmaP) > kEps && ++iterLimit < 100)
        {
            cos2SigmaM = cos(2.0 * sigma1 + sigma);
            sinSigma = sin(sigma);
            cosSigma = cos(sigma);
            double cos2SigmaSq = cos2SigmaM * cos2SigmaM;
            double deltaSigma = B * sinSigma * (cos2SigmaM + B * 0.25 * (cosSigma * (-1.0 + 2.0 * cos2SigmaSq) -
                                                                         B / 6.0 * cos2SigmaM *
                                                                         (-3.0 + 4.0 * sinSigma * sinSigma) *
                                                                         (-3.0 + 4.0 * cos2SigmaSq)));

            sigmaP = sigma;
            sigma = s / (kSemiMinorAxis * A) + deltaSigma;
        }

        double tmp = sinU1 * sinSigma - cosU1 * cosSigma * cosAlpha1;
        double lat2 = atan2(sinU1 * cosSigma + cosU1 * sinSigma * cosAlpha1,
                            (1.0 - kFlattening) * sqrt(sinAlpha * sinAlpha + tmp * tmp));
        double lambda = atan2(sinSigma * sinAlpha1, cosU1 * cosSigma - sinU1 * sinSigma * cosAlpha1);
        double C = kFlattening / 16.0 * cosSqAlpha * (4.0 + kFlattening * (4.0 - 3.0 * cosSqAlpha));
        double L = lambda - (1.0 - C) * kFlattening * sinAlpha *
                            (sigma +
                             C * sinSigma * (cos2SigmaM + C * cosSigma * (-1.0 + 2.0 * cos2SigmaM * cos2SigmaM)));

        return LLPoint(lat2, pt.longitude + L);
    }